

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_uninit(ma_context *pContext)

{
  ma_context *pContext_local;
  
  if (pContext == (ma_context *)0x0) {
    pContext_local._4_4_ = -2;
  }
  else {
    (*pContext->onUninit)(pContext);
    ma_mutex_uninit(&pContext->deviceEnumLock);
    ma_mutex_uninit(&pContext->deviceInfoLock);
    ma__free_from_callbacks(pContext->pDeviceInfos,&pContext->allocationCallbacks);
    ma_context_uninit_backend_apis(pContext);
    pContext_local._4_4_ = 0;
  }
  return pContext_local._4_4_;
}

Assistant:

MA_API ma_result ma_context_uninit(ma_context* pContext)
{
    if (pContext == NULL) {
        return MA_INVALID_ARGS;
    }

    pContext->onUninit(pContext);

    ma_mutex_uninit(&pContext->deviceEnumLock);
    ma_mutex_uninit(&pContext->deviceInfoLock);
    ma__free_from_callbacks(pContext->pDeviceInfos, &pContext->allocationCallbacks);
    ma_context_uninit_backend_apis(pContext);

    return MA_SUCCESS;
}